

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::selectAll(QTreeView *this)

{
  SelectionMode SVar1;
  int arow;
  QTreeViewPrivate *this_00;
  long lVar2;
  QAbstractItemModel *pQVar3;
  int iVar4;
  QItemSelectionModel *pQVar5;
  fd_set *in_R8;
  timeval *in_R9;
  QTreeViewItem *this_01;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  if (pQVar5 != (QItemSelectionModel *)0x0) {
    SVar1 = (this_00->super_QAbstractItemViewPrivate).selectionMode;
    QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
    if ((SingleSelection < SVar1) && (lVar2 = (this_00->viewItems).d.size, lVar2 != 0)) {
      this_01 = (this_00->viewItems).d.ptr + lVar2 + -1;
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      arow = (this_01->index).r;
      pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
      QModelIndex::parent(&local_70,&this_01->index);
      iVar4 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_70);
      QModelIndex::sibling((QModelIndex *)&local_58,&this_01->index,arow,iVar4 + -1);
      QTreeViewPrivate::select
                (this_00,(int)(this_00->viewItems).d.ptr,(fd_set *)&local_58,(fd_set *)0x23,in_R8,
                 in_R9);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::selectAll()
{
    Q_D(QTreeView);
    if (!selectionModel())
        return;
    SelectionMode mode = d->selectionMode;
    d->executePostedLayout(); //make sure we lay out the items
    if (mode != SingleSelection && mode != NoSelection && !d->viewItems.isEmpty()) {
        const QModelIndex &idx = d->viewItems.constLast().index;
        QModelIndex lastItemIndex = idx.sibling(idx.row(), d->model->columnCount(idx.parent()) - 1);
        d->select(d->viewItems.constFirst().index, lastItemIndex,
                  QItemSelectionModel::ClearAndSelect
                  |QItemSelectionModel::Rows);
    }
}